

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O0

size_t Pass3::adjust_index(vector<const_Type_*,_std::allocator<const_Type_*>_> *types,
                          size_t old_index)

{
  bool bVar1;
  const_reference ppTVar2;
  undefined8 local_28;
  size_t i;
  size_t new_index;
  size_t old_index_local;
  vector<const_Type_*,_std::allocator<const_Type_*>_> *types_local;
  
  i = 0;
  for (local_28 = 0; local_28 < old_index; local_28 = local_28 + 1) {
    ppTVar2 = std::vector<const_Type_*,_std::allocator<const_Type_*>_>::operator[](types,local_28);
    bVar1 = is_empty_tuple(*ppTVar2);
    if (!bVar1) {
      i = i + 1;
    }
  }
  return i;
}

Assistant:

static std::size_t adjust_index(const std::vector<const Type*>& types, std::size_t old_index) {
		std::size_t new_index = 0;
		for (std::size_t i = 0; i < old_index; ++i) {
			if (!is_empty_tuple(types[i])) {
				++new_index;
			}
		}
		return new_index;
	}